

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

string * __thiscall
flatbuffers::php::PhpGenerator::GenDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,PhpGenerator *this,Value *value)

{
  int iVar1;
  Definition *def;
  bool bVar2;
  char *pcVar3;
  allocator<char> local_a9;
  int64_t local_a8;
  int64_t constant;
  allocator<char> local_89;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  EnumVal *local_28;
  EnumVal *val;
  Value *value_local;
  PhpGenerator *this_local;
  
  val = (EnumVal *)value;
  value_local = (Value *)this;
  this_local = (PhpGenerator *)__return_storage_ptr__;
  if ((value->type).enum_def != (EnumDef *)0x0) {
    local_28 = EnumDef::FindByValue((value->type).enum_def,&value->constant);
    if (local_28 != (EnumVal *)0x0) {
      def = (Definition *)(val->name).field_2._M_allocated_capacity;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
      BaseGenerator::WrapInNameSpace(&local_68,&this->super_BaseGenerator,def,&local_88);
      std::operator+(&local_48,&local_68,"::");
      std::operator+(__return_storage_ptr__,&local_48,&local_28->name);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      return __return_storage_ptr__;
    }
    local_28 = (EnumVal *)0x0;
  }
  iVar1 = *(int *)&val->name;
  if (iVar1 == 2) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &val->doc_comment,"0");
    pcVar3 = "true";
    if (bVar2) {
      pcVar3 = "false";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar3,(allocator<char> *)((long)&constant + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&constant + 3));
  }
  else if (iVar1 - 9U < 2) {
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &val->doc_comment,"0");
    if (bVar2) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_a8 = StringToInt(pcVar3,10);
      NumToString<long>(__return_storage_ptr__,local_a8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"0",&local_a9);
      std::allocator<char>::~allocator(&local_a9);
    }
  }
  else if (iVar1 == 0xd) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",(allocator<char> *)((long)&constant + 2));
    std::allocator<char>::~allocator((allocator<char> *)((long)&constant + 2));
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&val->doc_comment);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultValue(const Value &value) {
    if (value.type.enum_def) {
      if (auto val = value.type.enum_def->FindByValue(value.constant)) {
        return WrapInNameSpace(*value.type.enum_def) + "::" + val->name;
      }
    }

    switch (value.type.base_type) {
      case BASE_TYPE_BOOL: return value.constant == "0" ? "false" : "true";

      case BASE_TYPE_STRING: return "null";

      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG:
        if (value.constant != "0") {
          int64_t constant = StringToInt(value.constant.c_str());
          return NumToString(constant);
        }
        return "0";

      default: return value.constant;
    }
  }